

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O1

Result wabt::GenerateNames(Module *module,NameOpts opts)

{
  ulong *puVar1;
  pointer ppIVar2;
  Import *pIVar3;
  pointer pcVar4;
  pointer ppEVar5;
  Export *pEVar6;
  pointer pTVar7;
  pointer pTVar8;
  Index IVar9;
  Index IVar10;
  Index IVar11;
  Index IVar12;
  Result RVar13;
  long *plVar14;
  Func *pFVar15;
  pointer ppGVar16;
  pointer ppTVar17;
  pointer ppFVar18;
  pointer ppTVar19;
  pointer ppMVar20;
  pointer ppEVar21;
  pointer ppDVar22;
  pointer ppEVar23;
  char *prefix;
  FuncImport *func_import;
  long lVar24;
  BindingHash *pBVar25;
  pointer ppIVar26;
  Import *str;
  pointer ppEVar27;
  ulong uVar28;
  ulong uVar29;
  __string_type __str;
  NameGenerator generator;
  string new_name;
  undefined1 local_f8 [40];
  NameGenerator local_d0;
  string local_50;
  
  local_d0.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_001aad00;
  local_d0.module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor(&local_d0.visitor_,(Delegate *)&local_d0);
  local_d0.num_global_imports_ = 0;
  local_d0.num_event_imports_ = 0;
  local_d0.label_count_ = 0;
  local_d0.num_func_imports_ = 0;
  local_d0.num_table_imports_ = 0;
  local_d0.num_memory_imports_ = 0;
  ppIVar2 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_d0.module_ = module;
  local_d0.opts_ = opts;
  uVar29 = local_d0._96_8_;
  for (ppIVar26 = (module->imports).
                  super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
                  super__Vector_impl_data._M_start; local_d0._96_8_ = uVar29, ppIVar26 != ppIVar2;
      ppIVar26 = ppIVar26 + 1) {
    pIVar3 = *ppIVar26;
    IVar10 = local_d0.num_global_imports_;
    IVar11 = local_d0.num_event_imports_;
    IVar12 = local_d0.num_table_imports_;
    IVar9 = local_d0.num_memory_imports_;
    switch(pIVar3->kind_) {
    case First:
      if (pIVar3 == (Import *)0x0) break;
      pBVar25 = &(local_d0.module_)->func_bindings;
      str = pIVar3 + 1;
      local_d0.num_func_imports_ = (Index)(uVar29 >> 0x20);
      IVar12 = local_d0.num_func_imports_;
      local_d0.label_count_ = (Index)uVar29;
      local_d0.num_func_imports_ = local_d0.num_func_imports_ + 1;
      goto LAB_0014e768;
    case Table:
      if (pIVar3 != (Import *)0x0) {
        pBVar25 = &(local_d0.module_)->table_bindings;
        str = pIVar3 + 1;
        local_d0.num_table_imports_ = local_d0.num_table_imports_ + 1;
        goto LAB_0014e768;
      }
      break;
    case Memory:
      if (pIVar3 != (Import *)0x0) {
        pBVar25 = &(local_d0.module_)->memory_bindings;
        str = pIVar3 + 1;
        local_d0.num_memory_imports_ = local_d0.num_memory_imports_ + 1;
        IVar12 = IVar9;
        goto LAB_0014e768;
      }
      break;
    case Global:
      if (pIVar3 != (Import *)0x0) {
        pBVar25 = &(local_d0.module_)->global_bindings;
        str = pIVar3 + 1;
        local_d0.num_global_imports_ = local_d0.num_global_imports_ + 1;
        IVar12 = IVar10;
        goto LAB_0014e768;
      }
      break;
    case Event:
      if (pIVar3 != (Import *)0x0) {
        pBVar25 = &(local_d0.module_)->event_bindings;
        str = pIVar3 + 1;
        local_d0.num_event_imports_ = local_d0.num_event_imports_ + 1;
        IVar12 = IVar11;
        goto LAB_0014e768;
      }
    }
    str = (Import *)0x0;
    pBVar25 = (BindingHash *)0x0;
    IVar12 = 0xffffffff;
LAB_0014e768:
    if ((pBVar25 != (BindingHash *)0x0) && (str != (Import *)0x0)) {
      if (IVar12 == 0xffffffff) {
        __assert_fail("index != kInvalidIndex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/generate-names.cc"
                      ,0x14a,
                      "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
      }
      local_f8._0_8_ = local_f8 + 0x10;
      pcVar4 = (pIVar3->module_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar4,pcVar4 + (pIVar3->module_name)._M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)local_f8,local_f8._8_8_,0,'\x01');
      plVar14 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_f8,(ulong)(pIVar3->field_name)._M_dataplus._M_p);
      puVar1 = (ulong *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1) {
        local_50.field_2._M_allocated_capacity = *puVar1;
        local_50.field_2._8_8_ = plVar14[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *puVar1;
        local_50._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_50._M_string_length = plVar14[1];
      *plVar14 = (long)puVar1;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      anon_unknown_19::NameGenerator::MaybeUseAndBindName
                (&local_d0,pBVar25,local_50._M_dataplus._M_p,IVar12,(string *)str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    uVar29 = local_d0._96_8_;
  }
  ppEVar5 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar27 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar27 != ppEVar5; ppEVar27 = ppEVar27 + 1) {
    pEVar6 = *ppEVar27;
    IVar12 = 0xffffffff;
    switch(pEVar6->kind) {
    case First:
      pFVar15 = Module::GetFunc(local_d0.module_,&pEVar6->var);
      if (pFVar15 == (Func *)0x0) break;
      IVar12 = Module::GetFuncIndex(local_d0.module_,&pEVar6->var);
      lVar24 = 0x1b0;
LAB_0014e9cc:
      pBVar25 = (BindingHash *)((long)&((local_d0.module_)->loc).filename.data_ + lVar24);
      goto LAB_0014e9d6;
    case Table:
      pFVar15 = (Func *)Module::GetTable(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetTableIndex(local_d0.module_,&pEVar6->var);
        lVar24 = 0x290;
        goto LAB_0014e9cc;
      }
      break;
    case Memory:
      pFVar15 = (Func *)Module::GetMemory(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetMemoryIndex(local_d0.module_,&pEVar6->var);
        lVar24 = 0x2c8;
        goto LAB_0014e9cc;
      }
      break;
    case Global:
      pFVar15 = (Func *)Module::GetGlobal(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetGlobalIndex(local_d0.module_,&pEVar6->var);
        lVar24 = 0x1e8;
        goto LAB_0014e9cc;
      }
      break;
    case Event:
      pFVar15 = (Func *)Module::GetEvent(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetEventIndex(local_d0.module_,&pEVar6->var);
        lVar24 = 0x178;
        goto LAB_0014e9cc;
      }
    }
    pFVar15 = (Func *)0x0;
    pBVar25 = (BindingHash *)0x0;
LAB_0014e9d6:
    if ((pFVar15 != (Func *)0x0) && (pBVar25 != (BindingHash *)0x0)) {
      anon_unknown_19::NameGenerator::MaybeUseAndBindName
                (&local_d0,pBVar25,(pEVar6->name)._M_dataplus._M_p,IVar12,&pFVar15->name);
    }
  }
  ppGVar16 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar16) {
    uVar29 = 0;
    do {
      if ((ppGVar16[uVar29]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->global_bindings,"g",(Index)uVar29,
                   &ppGVar16[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppGVar16 = (module->globals).
                 super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar16 >> 3
                             ));
  }
  ppTVar17 = (module->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppTVar17) {
    uVar29 = 0;
    do {
      if ((ppTVar17[uVar29]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->type_bindings,"t",(Index)uVar29,
                   &ppTVar17[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppTVar17 = (module->types).
                 super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(module->types).
                                    super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar17 >> 3
                             ));
  }
  ppFVar18 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar18) {
    uVar29 = 0;
    do {
      pFVar15 = ppFVar18[uVar29];
      if ((pFVar15->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->func_bindings,"f",(Index)uVar29,&pFVar15->name);
      }
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = (pointer)0x0;
      local_f8._16_8_ = (pointer)0x0;
      pTVar7 = (pFVar15->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar8 = (pFVar15->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      IVar12 = LocalTypes::size(&pFVar15->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)((int)((ulong)((long)pTVar7 - (long)pTVar8) >> 2) + IVar12),
                 &pFVar15->bindings,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_f8);
      if (local_f8._8_8_ != local_f8._0_8_) {
        lVar24 = 0;
        uVar28 = 0;
        do {
          if (*(long *)((long)(local_f8._0_8_ + 8) + lVar24) == 0) {
            prefix = "p";
            if (((ulong)((long)(pFVar15->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pFVar15->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2 & 0xffffffff) <= uVar28) {
              prefix = "l";
            }
            local_50._M_string_length = 0;
            local_50.field_2._M_allocated_capacity =
                 local_50.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            anon_unknown_19::NameGenerator::GenerateAndBindName
                      (&local_d0,&pFVar15->bindings,prefix,(Index)uVar28,&local_50);
            std::__cxx11::string::_M_assign
                      ((string *)((long)&((_Alloc_hider *)local_f8._0_8_)->_M_p + lVar24));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          uVar28 = uVar28 + 1;
          lVar24 = lVar24 + 0x20;
        } while (uVar28 < (ulong)((long)(local_f8._8_8_ - local_f8._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      local_d0._96_8_ = local_d0._96_8_ & 0xffffffff00000000;
      RVar13 = ExprVisitor::VisitFunc(&local_d0.visitor_,pFVar15);
      if (RVar13.enum_ == Error) break;
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppFVar18 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(module->funcs).
                                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar18 >> 3)
            );
  }
  ppTVar19 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar19) {
    uVar29 = 0;
    do {
      if ((ppTVar19[uVar29]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->table_bindings,"T",(Index)uVar29,
                   &ppTVar19[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppTVar19 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(module->tables).
                                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar19 >> 3
                             ));
  }
  ppMVar20 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppMVar20) {
    uVar29 = 0;
    do {
      if ((ppMVar20[uVar29]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->memory_bindings,"M",(Index)uVar29,
                   &ppMVar20[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppMVar20 = (module->memories).
                 super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(module->memories).
                                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar20 >> 3
                             ));
  }
  ppEVar21 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar21) {
    uVar29 = 0;
    do {
      if ((ppEVar21[uVar29]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->event_bindings,"e",(Index)uVar29,
                   &ppEVar21[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppEVar21 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(module->events).
                                    super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar21 >> 3
                             ));
  }
  ppDVar22 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar22) {
    uVar29 = 0;
    do {
      if ((ppDVar22[uVar29]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->data_segment_bindings,"d",(Index)uVar29,
                   &ppDVar22[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppDVar22 = (module->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(module->data_segments).
                                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar22 >> 3
                             ));
  }
  ppEVar23 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar23) {
    uVar29 = 0;
    do {
      if ((ppEVar23[uVar29]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->elem_segment_bindings,"e",(Index)uVar29,
                   &ppEVar23[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppEVar23 = (module->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(module->elem_segments).
                                    super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar23 >> 3
                             ));
  }
  local_d0.module_ = (Module *)0x0;
  local_d0.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_001aad00;
  if (local_d0.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.visitor_.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d0.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)Ok;
}

Assistant:

Result GenerateNames(Module* module, NameOpts opts) {
  NameGenerator generator(opts);
  return generator.VisitModule(module);
}